

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGSchemaFacetCheck
              (void *data,xmlChar *type,xmlChar *facetname,xmlChar *val,xmlChar *strval,void *value)

{
  int iVar1;
  xmlSchemaTypePtr typeDecl;
  xmlSchemaFacetPtr facet_00;
  int ret;
  xmlSchemaTypePtr_conflict typ;
  xmlSchemaFacetPtr facet;
  void *value_local;
  xmlChar *strval_local;
  xmlChar *val_local;
  xmlChar *facetname_local;
  xmlChar *type_local;
  void *data_local;
  
  if ((type == (xmlChar *)0x0) || (strval == (xmlChar *)0x0)) {
    data_local._4_4_ = -1;
  }
  else {
    typeDecl = xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    if (typeDecl == (xmlSchemaTypePtr)0x0) {
      data_local._4_4_ = -1;
    }
    else {
      facet_00 = xmlSchemaNewFacet();
      if (facet_00 == (xmlSchemaFacetPtr)0x0) {
        data_local._4_4_ = -1;
      }
      else {
        iVar1 = xmlStrEqual(facetname,(xmlChar *)"minInclusive");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(facetname,(xmlChar *)"minExclusive");
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(facetname,(xmlChar *)"maxInclusive");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(facetname,(xmlChar *)"maxExclusive");
              if (iVar1 == 0) {
                iVar1 = xmlStrEqual(facetname,(xmlChar *)"totalDigits");
                if (iVar1 == 0) {
                  iVar1 = xmlStrEqual(facetname,(xmlChar *)"fractionDigits");
                  if (iVar1 == 0) {
                    iVar1 = xmlStrEqual(facetname,"pattern");
                    if (iVar1 == 0) {
                      iVar1 = xmlStrEqual(facetname,"enumeration");
                      if (iVar1 == 0) {
                        iVar1 = xmlStrEqual(facetname,(xmlChar *)"whiteSpace");
                        if (iVar1 == 0) {
                          iVar1 = xmlStrEqual(facetname,"length");
                          if (iVar1 == 0) {
                            iVar1 = xmlStrEqual(facetname,(xmlChar *)"maxLength");
                            if (iVar1 == 0) {
                              iVar1 = xmlStrEqual(facetname,(xmlChar *)"minLength");
                              if (iVar1 == 0) {
                                xmlSchemaFreeFacet(facet_00);
                                return -1;
                              }
                              facet_00->type = XML_SCHEMA_FACET_MINLENGTH;
                            }
                            else {
                              facet_00->type = XML_SCHEMA_FACET_MAXLENGTH;
                            }
                          }
                          else {
                            facet_00->type = XML_SCHEMA_FACET_LENGTH;
                          }
                        }
                        else {
                          facet_00->type = XML_SCHEMA_FACET_WHITESPACE;
                        }
                      }
                      else {
                        facet_00->type = XML_SCHEMA_FACET_ENUMERATION;
                      }
                    }
                    else {
                      facet_00->type = XML_SCHEMA_FACET_PATTERN;
                    }
                  }
                  else {
                    facet_00->type = XML_SCHEMA_FACET_FRACTIONDIGITS;
                  }
                }
                else {
                  facet_00->type = XML_SCHEMA_FACET_TOTALDIGITS;
                }
              }
              else {
                facet_00->type = XML_SCHEMA_FACET_MAXEXCLUSIVE;
              }
            }
            else {
              facet_00->type = XML_SCHEMA_FACET_MAXINCLUSIVE;
            }
          }
          else {
            facet_00->type = XML_SCHEMA_FACET_MINEXCLUSIVE;
          }
        }
        else {
          facet_00->type = XML_SCHEMA_FACET_MININCLUSIVE;
        }
        facet_00->value = val;
        iVar1 = xmlSchemaCheckFacet(facet_00,typeDecl,(xmlSchemaParserCtxtPtr)0x0,type);
        if (iVar1 == 0) {
          iVar1 = xmlSchemaValidateFacet(typeDecl,facet_00,strval,(xmlSchemaValPtr)value);
          xmlSchemaFreeFacet(facet_00);
          if (iVar1 == 0) {
            data_local._4_4_ = 0;
          }
          else {
            data_local._4_4_ = -1;
          }
        }
        else {
          xmlSchemaFreeFacet(facet_00);
          data_local._4_4_ = -1;
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
xmlRelaxNGSchemaFacetCheck(void *data ATTRIBUTE_UNUSED,
                           const xmlChar * type, const xmlChar * facetname,
                           const xmlChar * val, const xmlChar * strval,
                           void *value)
{
    xmlSchemaFacetPtr facet;
    xmlSchemaTypePtr typ;
    int ret;

    if ((type == NULL) || (strval == NULL))
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (-1);

    facet = xmlSchemaNewFacet();
    if (facet == NULL)
        return (-1);

    if (xmlStrEqual(facetname, BAD_CAST "minInclusive")) {
        facet->type = XML_SCHEMA_FACET_MININCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "minExclusive")) {
        facet->type = XML_SCHEMA_FACET_MINEXCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "maxInclusive")) {
        facet->type = XML_SCHEMA_FACET_MAXINCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "maxExclusive")) {
        facet->type = XML_SCHEMA_FACET_MAXEXCLUSIVE;
    } else if (xmlStrEqual(facetname, BAD_CAST "totalDigits")) {
        facet->type = XML_SCHEMA_FACET_TOTALDIGITS;
    } else if (xmlStrEqual(facetname, BAD_CAST "fractionDigits")) {
        facet->type = XML_SCHEMA_FACET_FRACTIONDIGITS;
    } else if (xmlStrEqual(facetname, BAD_CAST "pattern")) {
        facet->type = XML_SCHEMA_FACET_PATTERN;
    } else if (xmlStrEqual(facetname, BAD_CAST "enumeration")) {
        facet->type = XML_SCHEMA_FACET_ENUMERATION;
    } else if (xmlStrEqual(facetname, BAD_CAST "whiteSpace")) {
        facet->type = XML_SCHEMA_FACET_WHITESPACE;
    } else if (xmlStrEqual(facetname, BAD_CAST "length")) {
        facet->type = XML_SCHEMA_FACET_LENGTH;
    } else if (xmlStrEqual(facetname, BAD_CAST "maxLength")) {
        facet->type = XML_SCHEMA_FACET_MAXLENGTH;
    } else if (xmlStrEqual(facetname, BAD_CAST "minLength")) {
        facet->type = XML_SCHEMA_FACET_MINLENGTH;
    } else {
        xmlSchemaFreeFacet(facet);
        return (-1);
    }
    facet->value = val;
    ret = xmlSchemaCheckFacet(facet, typ, NULL, type);
    if (ret != 0) {
        xmlSchemaFreeFacet(facet);
        return (-1);
    }
    ret = xmlSchemaValidateFacet(typ, facet, strval, value);
    xmlSchemaFreeFacet(facet);
    if (ret != 0)
        return (-1);
    return (0);
}